

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void CopyPlane_16(uint16 *src_y,int src_stride_y,uint16 *dst_y,int dst_stride_y,int width,int height
                 )

{
  _func_void_uint16_ptr_uint16_ptr_int *CopyRow;
  int y;
  int height_local;
  int width_local;
  int dst_stride_y_local;
  uint16 *dst_y_local;
  uint16 *puStack_10;
  int src_stride_y_local;
  uint16 *src_y_local;
  
  CopyRow._4_4_ = height;
  y = width;
  height_local = dst_stride_y;
  dst_y_local._4_4_ = src_stride_y;
  if ((src_stride_y == width) && (dst_stride_y == width)) {
    y = height * width;
    CopyRow._4_4_ = 1;
    height_local = 0;
    dst_y_local._4_4_ = 0;
  }
  _width_local = dst_y;
  puStack_10 = src_y;
  for (CopyRow._0_4_ = 0; (int)CopyRow < CopyRow._4_4_; CopyRow._0_4_ = (int)CopyRow + 1) {
    CopyRow_16_C(puStack_10,_width_local,y);
    puStack_10 = puStack_10 + dst_y_local._4_4_;
    _width_local = _width_local + height_local;
  }
  return;
}

Assistant:

LIBYUV_API
void CopyPlane_16(const uint16* src_y,
                  int src_stride_y,
                  uint16* dst_y,
                  int dst_stride_y,
                  int width,
                  int height) {
  int y;
  void (*CopyRow)(const uint16* src, uint16* dst, int width) = CopyRow_16_C;
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
#if defined(HAS_COPYROW_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(width, 32)) {
    CopyRow = CopyRow_16_SSE2;
  }
#endif
#if defined(HAS_COPYROW_16_ERMS)
  if (TestCpuFlag(kCpuHasERMS)) {
    CopyRow = CopyRow_16_ERMS;
  }
#endif
#if defined(HAS_COPYROW_16_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 32)) {
    CopyRow = CopyRow_16_NEON;
  }
#endif
#if defined(HAS_COPYROW_16_MIPS)
  if (TestCpuFlag(kCpuHasMIPS)) {
    CopyRow = CopyRow_16_MIPS;
  }
#endif

  // Copy plane
  for (y = 0; y < height; ++y) {
    CopyRow(src_y, dst_y, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}